

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::HashAggregateDistinctFinalizeTask::~HashAggregateDistinctFinalizeTask
          (HashAggregateDistinctFinalizeTask *this)

{
  (this->super_ExecutorTask).super_Task._vptr_Task =
       (_func_int **)&PTR__HashAggregateDistinctFinalizeTask_027beab8;
  ::std::unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>::
  ~unique_ptr(&(this->radix_table_lstate).
               super_unique_ptr<duckdb::LocalSourceState,_std::default_delete<duckdb::LocalSourceState>_>
             );
  ::std::unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>::
  ~unique_ptr(&(this->local_sink_state).
               super_unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>_>
             );
  ExecutorTask::~ExecutorTask(&this->super_ExecutorTask);
  return;
}

Assistant:

HashAggregateDistinctFinalizeTask(Pipeline &pipeline, shared_ptr<Event> event_p, const PhysicalHashAggregate &op,
	                                  HashAggregateGlobalSinkState &state_p)
	    : ExecutorTask(pipeline.executor, std::move(event_p)), pipeline(pipeline), op(op), gstate(state_p) {
	}